

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_geom.c
# Opt level: O3

REF_STATUS
ref_geom_cell_tuv(REF_GEOM ref_geom,REF_INT node,REF_INT *nodes,REF_INT type,REF_DBL *param,
                 REF_INT *sens)

{
  REF_INT RVar1;
  int iVar2;
  REF_DBL *pRVar3;
  REF_INT *pRVar4;
  uint uVar5;
  uint uVar6;
  ulong uVar7;
  uint uVar8;
  undefined4 in_register_0000000c;
  long lVar9;
  undefined8 uVar10;
  REF_GEOM pRVar11;
  char *pcVar12;
  ulong uVar13;
  undefined4 uVar14;
  undefined4 uVar15;
  REF_DBL RVar16;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  REF_DBL RVar19;
  double dVar20;
  double dVar21;
  REF_INT from_geom;
  double trange [2];
  REF_INT geom;
  double uv [2];
  double uvtmax [2];
  double uv1 [2];
  int local_e0;
  int local_cc;
  REF_INT *local_c8;
  REF_INT *local_c0;
  REF_DBL *local_b8;
  REF_GEOM local_b0;
  REF_DBL local_a8;
  double dStack_a0;
  int local_90;
  int local_8c;
  undefined1 local_88 [16];
  double local_78;
  double dStack_70;
  long local_60;
  REF_DBL local_58;
  double local_50;
  double local_48;
  double dStack_40;
  
  if (type - 1U < 2) {
    uVar8 = nodes[(ulong)(uint)type + 1];
    uVar13 = (ulong)(type + 1);
    uVar5 = 0xffffffff;
    uVar7 = 0;
    do {
      if (nodes[uVar7] == node) {
        if (uVar5 != 0xffffffff) {
          printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",
                 0x302,"ref_geom_cell_tuv","node found twice in nodes",0xffffffffffffffff,
                 (long)(int)uVar5);
          return 1;
        }
        uVar5 = (uint)uVar7;
      }
      uVar7 = uVar7 + 1;
    } while (uVar13 != uVar7);
    if (uVar5 != 0xffffffff) {
      local_c0 = sens;
      local_b8 = param;
      local_b0 = ref_geom;
      uVar6 = ref_geom_find(ref_geom,node,type,uVar8,&local_8c);
      pRVar11 = local_b0;
      pRVar3 = local_b8;
      if (uVar6 != 0) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",
               0x30b,"ref_geom_cell_tuv",(ulong)uVar6,"not found");
        printf(" %d type %d id\n",CONCAT44(in_register_0000000c,type),(ulong)uVar8);
        ref_geom_tattle(local_b0,node);
        return uVar6;
      }
      local_c8 = local_b0->descr;
      lVar9 = (long)local_8c;
      local_90 = local_c8[lVar9 * 6 + 3];
      if ((local_90 == 0) && (local_c8[lVar9 * 6 + 4] == 0)) {
        pRVar3 = local_b0->param;
        *local_b8 = pRVar3[lVar9 * 2];
        if (1 < type) {
          local_b8[1] = pRVar3[(int)(local_8c * 2 | 1)];
        }
        *local_c0 = 0;
        return 0;
      }
      if (type == 1) {
        uVar6 = ref_egads_edge_trange(local_b0,uVar8,&local_a8);
        pRVar4 = local_c0;
        if (uVar6 == 0) {
          uVar6 = ref_geom_tuv(pRVar11,nodes[(int)(1 - uVar5)],1,uVar8,&local_78);
          if (uVar6 == 0) {
            if ((0.0 <= local_78 - local_a8) && (0.0 <= dStack_a0 - local_78)) {
              if (local_78 - local_a8 < dStack_a0 - local_78) {
                *pRVar4 = 1;
                *pRVar3 = local_a8;
                return 0;
              }
              *pRVar4 = -1;
              *pRVar3 = dStack_a0;
              return 0;
            }
            printf(" from t = %e %e %e, dist = %e %e\n");
            pcVar12 = "from node not in trange";
            uVar10 = 799;
            goto LAB_00183c30;
          }
          pcVar12 = "from tuv";
          uVar10 = 0x319;
        }
        else {
          pcVar12 = "trange";
          uVar10 = 0x317;
        }
      }
      else {
        local_60 = lVar9;
        if (local_c8[lVar9 * 6 + 4] == 0) {
          local_88._4_4_ = 0;
          local_88._0_4_ = uVar5;
          local_e0 = -1;
          uVar7 = 0;
          do {
            RVar1 = nodes[uVar7];
            uVar6 = ref_geom_find(local_b0,RVar1,type,uVar8,&local_cc);
            pRVar11 = local_b0;
            if (uVar6 != 0) {
              pcVar12 = "not found";
              uVar10 = 0x32e;
              goto LAB_00184010;
            }
            if (((local_88._0_8_ != uVar7) && (local_c8[(long)local_cc * 6 + 3] == 0)) &&
               (local_c8[(long)local_cc * 6 + 4] == 0)) {
              local_e0 = RVar1;
            }
            uVar7 = uVar7 + 1;
          } while (uVar13 != uVar7);
          if (local_e0 == -1) {
            printf("%s: %d: %s: %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",
                   0x33a,"ref_geom_cell_tuv","can\'t find from tuv in tri cell");
            ref_geom_tattle(pRVar11,*nodes);
            ref_geom_tattle(pRVar11,nodes[1]);
            ref_geom_tattle(pRVar11,nodes[2]);
            printf("faceid %d node %d node_index %d\n",(ulong)uVar8,(ulong)(uint)node,(ulong)uVar5);
            return 1;
          }
          uVar6 = ref_geom_tuv(local_b0,local_e0,2,uVar8,&local_78);
          iVar2 = local_90;
          if (uVar6 == 0) {
            uVar6 = ref_geom_tuv(pRVar11,node,1,local_90,&local_58);
            if (uVar6 == 0) {
              uVar6 = ref_egads_edge_face_uv(pRVar11,iVar2,uVar8,1,local_58,&local_a8);
              if (uVar6 == 0) {
                uVar6 = ref_egads_edge_face_uv(pRVar11,iVar2,uVar8,-1,local_58,&local_48);
                if (uVar6 == 0) {
                  dVar20 = (local_a8 - local_78) * (local_a8 - local_78);
                  dVar21 = (local_48 - local_78) * (local_48 - local_78);
                  auVar17._8_8_ = dVar21;
                  auVar17._0_8_ = dVar20;
                  auVar18._8_8_ = (dStack_40 - dStack_70) * (dStack_40 - dStack_70) + dVar21;
                  auVar18._0_8_ = (dStack_a0 - dStack_70) * (dStack_a0 - dStack_70) + dVar20;
                  auVar18 = sqrtpd(auVar17,auVar18);
                  if (auVar18._0_8_ < auVar18._8_8_) {
                    *local_c0 = 1;
                    *local_b8 = local_a8;
                    local_b8[1] = dStack_a0;
                    return 0;
                  }
                  *local_c0 = -1;
                  *local_b8 = local_48;
                  local_b8[1] = dStack_40;
                  return 0;
                }
                pcVar12 = "uv -1";
                uVar10 = 0x33f;
              }
              else {
                pcVar12 = "uv 1";
                uVar10 = 0x33e;
              }
            }
            else {
              pcVar12 = "edge t0";
              uVar10 = 0x33d;
            }
          }
          else {
            pcVar12 = "from uv";
            uVar10 = 0x33c;
          }
        }
        else {
          local_88 = ZEXT816(0);
          uVar7 = 0;
          local_c8 = (REF_INT *)((ulong)local_c8 & 0xffffffff00000000);
          do {
            RVar1 = nodes[uVar7];
            uVar6 = ref_geom_find(pRVar11,RVar1,type,uVar8,&local_cc);
            if (uVar6 != 0) {
              pcVar12 = "not found";
              uVar10 = 0x351;
              goto LAB_00184010;
            }
            if ((pRVar11->descr[(long)local_cc * 6 + 3] == 0) &&
               (pRVar11->descr[(long)local_cc * 6 + 4] == 0)) {
              uVar6 = ref_geom_tuv(pRVar11,RVar1,2,uVar8,&local_78);
              if (uVar6 != 0) {
                pcVar12 = "from uv";
                uVar10 = 0x355;
                goto LAB_00184010;
              }
              dVar20 = (double)local_88._8_8_ + dStack_70;
              local_88._8_4_ = SUB84(dVar20,0);
              local_88._0_8_ = (double)local_88._0_8_ + local_78;
              local_88._12_4_ = (int)((ulong)dVar20 >> 0x20);
              local_c8 = (REF_INT *)CONCAT44(local_c8._4_4_,(int)local_c8 + 1);
              pRVar11 = local_b0;
            }
            pRVar4 = local_c0;
            uVar7 = uVar7 + 1;
          } while (uVar13 != uVar7);
          if ((int)local_c8 < 1) {
            pcVar12 = "no seed uv found for DEGEN";
            uVar10 = 0x35b;
            goto LAB_00183c30;
          }
          *local_c0 = 0;
          iVar2 = pRVar11->descr[lVar9 * 6 + 4];
          RVar1 = -iVar2;
          if (0 < iVar2) {
            RVar1 = iVar2;
          }
          uVar6 = ref_egads_edge_trange(pRVar11,RVar1,&local_a8);
          if (uVar6 == 0) {
            uVar8 = (uint)(lVar9 * 6) | 1;
            uVar6 = ref_egads_edge_face_uv
                              (pRVar11,RVar1,pRVar11->descr[(int)uVar8],*pRVar4,local_a8,&local_48);
            pRVar3 = local_b8;
            if (uVar6 == 0) {
              uVar6 = ref_egads_edge_face_uv
                                (pRVar11,RVar1,pRVar11->descr[(int)uVar8],*pRVar4,dStack_a0,
                                 &local_58);
              if (uVar6 == 0) {
                if (0 < pRVar11->descr[lVar9 * 6 + 4]) {
                  RVar19 = (double)local_88._8_8_ / (double)(int)local_c8;
                  *pRVar3 = pRVar11->param[local_60 * 2];
                  uVar14 = SUB84(dStack_40,0);
                  uVar15 = (undefined4)((ulong)dStack_40 >> 0x20);
                  dVar20 = dStack_40;
                  if (local_50 <= dStack_40) {
                    dVar20 = local_50;
                  }
                  if (RVar19 <= dVar20) {
                    RVar19 = dVar20;
                  }
                  if (dStack_40 <= local_50) {
                    uVar14 = SUB84(local_50,0);
                    uVar15 = (undefined4)((ulong)local_50 >> 0x20);
                  }
                  if ((double)CONCAT44(uVar15,uVar14) <= RVar19) {
                    RVar19 = (REF_DBL)CONCAT44(uVar15,uVar14);
                  }
                  pRVar3[1] = RVar19;
                  return 0;
                }
                RVar19 = (double)local_88._0_8_ / (double)(int)local_c8;
                uVar14 = SUB84(local_48,0);
                uVar15 = (undefined4)((ulong)local_48 >> 0x20);
                RVar16 = local_48;
                if (local_58 <= local_48) {
                  RVar16 = local_58;
                }
                if (RVar19 <= RVar16) {
                  RVar19 = RVar16;
                }
                if (local_48 <= local_58) {
                  uVar14 = SUB84(local_58,0);
                  uVar15 = (undefined4)((ulong)local_58 >> 0x20);
                }
                if ((double)CONCAT44(uVar15,uVar14) <= RVar19) {
                  RVar19 = (REF_DBL)CONCAT44(uVar15,uVar14);
                }
                *pRVar3 = RVar19;
                pRVar3[1] = pRVar11->param[(int)local_60 * 2 + 1];
                return 0;
              }
              pcVar12 = "uv t max";
              uVar10 = 0x369;
            }
            else {
              pcVar12 = "uv t min";
              uVar10 = 0x365;
            }
          }
          else {
            pcVar12 = "trange";
            uVar10 = 0x361;
          }
        }
      }
LAB_00184010:
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",uVar10
             ,"ref_geom_cell_tuv",(ulong)uVar6,pcVar12);
      return uVar6;
    }
    pcVar12 = "node not found in nodes";
    uVar10 = 0x306;
  }
  else {
    pcVar12 = "type not allowed";
    uVar10 = 0x2fc;
  }
LAB_00183c30:
  printf("%s: %d: %s: %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",uVar10,
         "ref_geom_cell_tuv",pcVar12);
  return 1;
}

Assistant:

REF_FCN REF_STATUS ref_geom_cell_tuv(REF_GEOM ref_geom, REF_INT node,
                                     REF_INT *nodes, REF_INT type,
                                     REF_DBL *param, REF_INT *sens) {
  REF_INT node_per;
  REF_INT id, edgeid, geom, from, from_geom;
  REF_INT node_index, cell_node;
  double trange[2], uv[2], uv0[2], uv1[2], uvtmin[2], uvtmax[2];
  REF_DBL from_param[2], t;
  REF_DBL dist0, dist1;
  REF_INT hits;

  RAS(1 <= type && type <= 2, "type not allowed");
  node_per = type + 1;
  id = nodes[node_per];
  node_index = REF_EMPTY;
  for (cell_node = 0; cell_node < node_per; cell_node++) {
    if (node == nodes[cell_node]) {
      REIS(REF_EMPTY, node_index, "node found twice in nodes");
      node_index = cell_node;
    }
  }
  RAS(REF_EMPTY != node_index, "node not found in nodes");

  RSB(ref_geom_find(ref_geom, node, type, id, &geom), "not found", {
    printf(" %d type %d id\n", type, id);
    ref_geom_tattle(ref_geom, node);
  });

  if (0 == ref_geom_jump(ref_geom, geom) &&
      0 == ref_geom_degen(ref_geom, geom)) {
    if (type > 0) param[0] = ref_geom_param(ref_geom, 0, geom);
    if (type > 1) param[1] = ref_geom_param(ref_geom, 1, geom);
    *sens = 0;
    return REF_SUCCESS;
  }

  switch (type) {
    case REF_GEOM_EDGE:
      RSS(ref_egads_edge_trange(ref_geom, id, trange), "trange");
      from = nodes[1 - node_index];
      RSS(ref_geom_tuv(ref_geom, from, type, id, from_param), "from tuv");
      dist0 = from_param[0] - trange[0];
      dist1 = trange[1] - from_param[0];
      if (dist0 < 0.0 || dist1 < 0.0) {
        printf(" from t = %e %e %e, dist = %e %e\n", trange[0], from_param[0],
               trange[1], dist0, dist1);
        THROW("from node not in trange");
      }
      if (dist0 < dist1) {
        *sens = 1;
        param[0] = trange[0];
      } else {
        *sens = -1;
        param[0] = trange[1];
      }
      break;
    case REF_GEOM_FACE:
      if (0 == ref_geom_degen(ref_geom, geom)) {
        from = REF_EMPTY;
        for (cell_node = 0; cell_node < node_per; cell_node++) {
          RSS(ref_geom_find(ref_geom, nodes[cell_node], type, id, &from_geom),
              "not found");
          if (node_index != cell_node &&
              0 == ref_geom_jump(ref_geom, from_geom) &&
              0 == ref_geom_degen(ref_geom, from_geom)) {
            from = nodes[cell_node];
          }
        }
        RAB(REF_EMPTY != from, "can't find from tuv in tri cell", {
          ref_geom_tattle(ref_geom, nodes[0]);
          ref_geom_tattle(ref_geom, nodes[1]);
          ref_geom_tattle(ref_geom, nodes[2]);
          printf("faceid %d node %d node_index %d\n", id, node, node_index);
        });
        edgeid = ref_geom_jump(ref_geom, geom);
        RSS(ref_geom_tuv(ref_geom, from, REF_GEOM_FACE, id, uv), "from uv");
        RSS(ref_geom_tuv(ref_geom, node, REF_GEOM_EDGE, edgeid, &t), "edge t0");
        RSS(ref_egads_edge_face_uv(ref_geom, edgeid, id, 1, t, uv0), "uv 1");
        RSS(ref_egads_edge_face_uv(ref_geom, edgeid, id, -1, t, uv1), "uv -1");
        dist0 = sqrt(pow(uv0[0] - uv[0], 2) + pow(uv0[1] - uv[1], 2));
        dist1 = sqrt(pow(uv1[0] - uv[0], 2) + pow(uv1[1] - uv[1], 2));
        if (dist0 < dist1) {
          *sens = 1;
          param[0] = uv0[0];
          param[1] = uv0[1];
        } else {
          *sens = -1;
          param[0] = uv1[0];
          param[1] = uv1[1];
        }
      } else {
        uv0[0] = 0.0;
        uv0[1] = 0.0;
        hits = 0;
        for (cell_node = 0; cell_node < node_per; cell_node++) {
          RSS(ref_geom_find(ref_geom, nodes[cell_node], type, id, &from_geom),
              "not found");
          if (0 == ref_geom_jump(ref_geom, from_geom) &&
              0 == ref_geom_degen(ref_geom, from_geom)) {
            RSS(ref_geom_tuv(ref_geom, nodes[cell_node], REF_GEOM_FACE, id, uv),
                "from uv");
            uv0[0] += uv[0];
            uv0[1] += uv[1];
            hits++;
          }
        }
        RAS(0 < hits, "no seed uv found for DEGEN");
        uv0[0] /= (REF_DBL)hits;
        uv0[1] /= (REF_DBL)hits;

        *sens = 0;
        edgeid = ABS(ref_geom_degen(ref_geom, geom));
        RSS(ref_egads_edge_trange(ref_geom, edgeid, trange), "trange");
        RSS(ref_egads_edge_face_uv(ref_geom, edgeid,
                                   ref_geom_id(ref_geom, geom), *sens,
                                   trange[0], uvtmin),
            "uv t min");
        RSS(ref_egads_edge_face_uv(ref_geom, edgeid,
                                   ref_geom_id(ref_geom, geom), *sens,
                                   trange[1], uvtmax),
            "uv t max");
        /* edgeid sign convention defined in ref_geom_mark_jump_degen */
        if (0 < ref_geom_degen(ref_geom, geom)) {
          param[0] = ref_geom_param(ref_geom, 0, geom);
          param[1] = uv0[1];
          param[1] = MAX(param[1], MIN(uvtmin[1], uvtmax[1]));
          param[1] = MIN(param[1], MAX(uvtmin[1], uvtmax[1]));
        } else {
          param[0] = uv0[0];
          param[0] = MAX(param[0], MIN(uvtmin[0], uvtmax[0]));
          param[0] = MIN(param[0], MAX(uvtmin[0], uvtmax[0]));
          param[1] = ref_geom_param(ref_geom, 1, geom);
        }
      }
      break;
    default:
      RSS(REF_IMPLEMENT, "can't to geom type yet");
  }

  return REF_SUCCESS;
}